

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O2

int mustach(char *template,mustach_itf *itf,void *closure,char **result,size_t *size)

{
  int iVar1;
  FILE *__stream;
  size_t *size_00;
  long in_FS_OFFSET;
  size_t s;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *result = (char *)0x0;
  size_00 = &s;
  if (size != (size_t *)0x0) {
    size_00 = size;
  }
  __stream = tmpfile();
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = fmustach(template,itf,closure,(FILE *)__stream);
    if (iVar1 < 0) {
      fclose(__stream);
      *result = (char *)0x0;
      *size_00 = 0;
    }
    else {
      iVar1 = memfile_close((FILE *)__stream,result,size_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int mustach(const char *template, struct mustach_itf *itf, void *closure, char **result, size_t *size)
{
	int rc;
	FILE *file;
	size_t s;

	*result = NULL;
	if (size == NULL)
		size = &s;
	file = memfile_open(result, size);
	if (file == NULL)
		rc = MUSTACH_ERROR_SYSTEM;
	else {
		rc = fmustach(template, itf, closure, file);
		if (rc < 0)
			memfile_abort(file, result, size);
		else
			rc = memfile_close(file, result, size);
	}
	return rc;
}